

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

object_class *
lsvm::object::new_class(package *pkg,symbol *name,object_class *super,uint16_t fields_count)

{
  object_class *poVar1;
  symbolmap *psVar2;
  ushort in_CX;
  object_class_t *in_RDX;
  symbol *in_RSI;
  package *in_RDI;
  uint16_t i;
  object_class *cls;
  size_t in_stack_ffffffffffffffc8;
  ushort local_2a;
  
  poVar1 = (object_class *)memory::allocate(in_stack_ffffffffffffffc8);
  poVar1->pkg = in_RDI;
  poVar1->name = in_RSI;
  poVar1->super = in_RDX;
  poVar1->fields_count = in_CX;
  psVar2 = symbol::new_symbolmap();
  poVar1->methods = psVar2;
  for (local_2a = 0; local_2a < in_CX; local_2a = local_2a + 1) {
    (&poVar1[1].pkg)[local_2a] = (package *)0x0;
  }
  return poVar1;
}

Assistant:

object_class* new_class(package* pkg, symbol* name, object_class* super, uint16_t fields_count){
    object_class* cls = (object_class*)lsvm::memory::allocate(sizeof(object_class)+(fields_count*sizeof(symbol*)));
    cls->pkg = pkg;
    cls->name = name;
    cls->super = super;
    cls->fields_count = fields_count;
    cls->methods = lsvm::symbol::new_symbolmap();

    for(uint16_t i = 0; i<fields_count; ++i){
        cls->fields[i] = null;
    }

    return cls;
}